

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

void Utils::print_vec_unicode_from_to
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *vec,int from,int to)

{
  uint uVar1;
  undefined8 in_RAX;
  int iVar2;
  long lVar3;
  char *pcVar4;
  bool bVar5;
  undefined1 auStack_38 [7];
  char local_31;
  
  iVar2 = to - from;
  _auStack_38 = in_RAX;
  if (iVar2 != 0 && from <= to) {
    lVar3 = (long)from;
    bVar5 = false;
    do {
      if (((lVar3 < 1) ||
          ((vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start[lVar3] != 0)) || (bVar5)) {
        uVar1 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar3];
        if (uVar1 != 0) {
          _auStack_38 = CONCAT17((char)uVar1,auStack_38);
          pcVar4 = auStack_38 + 7;
          goto LAB_00112e19;
        }
        bVar5 = true;
      }
      else {
        auStack_38 = (undefined1  [7])CONCAT16(0,auStack_38._0_6_);
        pcVar4 = auStack_38 + 6;
LAB_00112e19:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,1);
      }
      lVar3 = lVar3 + 1;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  return;
}

Assistant:

void Utils::print_vec_unicode_from_to(std::vector<unsigned int>& vec, int from, int to) {
    bool lastCharIsBlank = false;
    for(int i=from; i < to; ++i){
        if(i > 0 && vec[i] == 0 && !lastCharIsBlank) {
            std::cout << (char)vec[i];
            continue;
        }
        if (vec[i] == 0) {
            lastCharIsBlank = true;
            continue;
        }
        std::cout << (char)vec[i];
    }
    std::cout << endl;
}